

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

bool wallet::GetAvoidReuseFlag(CWallet *wallet,UniValue *param)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  undefined8 uVar4;
  string *in_RDI;
  long in_FS_OFFSET;
  bool avoid_reuse;
  bool can_avoid_reuse;
  UniValue *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  CWallet *in_stack_ffffffffffffff98;
  bool local_56;
  char *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = CWallet::IsWalletFlagSet
                    (in_stack_ffffffffffffff98,
                     CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
  bVar3 = UniValue::isNull(in_stack_ffffffffffffff88);
  local_56 = bVar2;
  if (!bVar3) {
    local_56 = UniValue::get_bool((UniValue *)
                                  CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
  }
  if ((local_56 == false) || (bVar2)) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return local_56;
    }
  }
  else {
    uVar4 = __cxa_allocate_exception(0x58);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
               in_stack_ffffffffffffffd0,(allocator<char> *)in_RDI);
    JSONRPCError(in_stack_ffffffffffffffdc,in_RDI);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(uVar4,&UniValue::typeinfo,UniValue::~UniValue);
    }
  }
  __stack_chk_fail();
}

Assistant:

bool GetAvoidReuseFlag(const CWallet& wallet, const UniValue& param) {
    bool can_avoid_reuse = wallet.IsWalletFlagSet(WALLET_FLAG_AVOID_REUSE);
    bool avoid_reuse = param.isNull() ? can_avoid_reuse : param.get_bool();

    if (avoid_reuse && !can_avoid_reuse) {
        throw JSONRPCError(RPC_WALLET_ERROR, "wallet does not have the \"avoid reuse\" feature enabled");
    }

    return avoid_reuse;
}